

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_NetworkAdapter.cpp
# Opt level: O0

char * axl::io::getNetworkAdapterTypeString(NetworkAdapterType adapterKind)

{
  char *local_10;
  NetworkAdapterType adapterKind_local;
  
  if (adapterKind < NetworkAdapterType__Count) {
    local_10 = getNetworkAdapterTypeString::stringTable[adapterKind];
  }
  else {
    local_10 = getNetworkAdapterTypeString::stringTable[0];
  }
  return local_10;
}

Assistant:

const char*
getNetworkAdapterTypeString(NetworkAdapterType adapterKind) {
	static const char* stringTable[NetworkAdapterType__Count] = {
		"unknown-adapter-kind", // NetworkAdapterType_Unknown,
		"loopback",             // NetworkAdapterType_Loopback,
		"ethernet",             // NetworkAdapterType_Ethernet,
		"wireless",             // NetworkAdapterType_Wireless,
		"PPP",                  // NetworkAdapterType_Ppp,
		"token ring",           // NetworkAdapterType_TokenRing,
		"slip",                 // NetworkAdapterType_Slip,
		"tunnel",               // NetworkAdapterType_Tunnel,
	};

	return (size_t)adapterKind < countof(stringTable) ?
		stringTable[adapterKind] :
		stringTable[NetworkAdapterType_Unknown];
}